

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::ComputeOutput(Renderer *this,float *buffer,int count)

{
  sample_t *psVar1;
  int local_2c;
  Voice *pVStack_28;
  int i;
  Voice *v;
  int count_local;
  float *buffer_local;
  Renderer *this_local;
  
  if (0 < count) {
    pVStack_28 = this->voice;
    memset(buffer,0,(long)count << 3);
    if (this->resample_buffer_size < count) {
      this->resample_buffer_size = count;
      psVar1 = (sample_t *)
               M_Realloc_Dbg(this->resample_buffer,(long)count << 3,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/timidity/timidity.cpp"
                             ,0x2e7);
      this->resample_buffer = psVar1;
    }
    for (local_2c = 0; local_2c < this->voices; local_2c = local_2c + 1) {
      if ((pVStack_28->status & 1) != 0) {
        mix_voice(this,buffer,pVStack_28,count);
      }
      pVStack_28 = pVStack_28 + 1;
    }
  }
  return;
}

Assistant:

void Renderer::ComputeOutput(float *buffer, int count)
{
	// count is in samples, not bytes.
	if (count <= 0)
	{
		return;
	}
	Voice *v = &voice[0];

	memset(buffer, 0, sizeof(float)*count*2);		// An integer 0 is also a float 0.
	if (resample_buffer_size < count)
	{
		resample_buffer_size = count;
		resample_buffer = (sample_t *)M_Realloc(resample_buffer, count * sizeof(float) * 2);
	}
	for (int i = 0; i < voices; i++, v++)
	{
		if (v->status & VOICE_RUNNING)
		{
			mix_voice(this, buffer, v, count);
		}
	}
}